

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3PagerSetPagesize(Pager *pPager,u32 *pPageSize,int nReserve)

{
  uint szPage;
  sqlite3_io_methods *psVar1;
  int iVar2;
  long in_RAX;
  char *pcVar3;
  char *pcVar4;
  ulong uVar5;
  i64 nByte;
  sqlite3_int64 local_38;
  
  szPage = *pPageSize;
  uVar5 = (ulong)szPage;
  local_38 = in_RAX;
  if ((pPager->memDb == '\0') || (iVar2 = 0, pPager->dbSize == 0)) {
    iVar2 = 0;
    if ((szPage != 0 && pPager->pPCache->nRefSum == 0) && (szPage != (uint)pPager->pageSize)) {
      local_38 = 0;
      iVar2 = 0;
      if (pPager->eState != '\0') {
        psVar1 = pPager->fd->pMethods;
        if (psVar1 != (sqlite3_io_methods *)0x0) {
          iVar2 = (*psVar1->xFileSize)(pPager->fd,&local_38);
        }
      }
      if (iVar2 == 0) {
        pcVar3 = (char *)pcache1Alloc(szPage + 8);
        pcVar4 = (char *)0x0;
        if (pcVar3 == (char *)0x0) {
          iVar2 = 7;
        }
        else {
          pcVar4 = pcVar3 + uVar5;
          pcVar4[0] = '\0';
          pcVar4[1] = '\0';
          pcVar4[2] = '\0';
          pcVar4[3] = '\0';
          pcVar4[4] = '\0';
          pcVar4[5] = '\0';
          pcVar4[6] = '\0';
          pcVar4[7] = '\0';
          iVar2 = 0;
          pcVar4 = pcVar3;
        }
      }
      else {
        pcVar4 = (char *)0x0;
      }
      if (iVar2 == 0) {
        pager_reset(pPager);
        iVar2 = sqlite3PcacheSetPageSize(pPager->pPCache,szPage);
      }
      if (iVar2 == 0) {
        pcache1Free(pPager->pTmpSpace);
        pPager->pTmpSpace = pcVar4;
        pPager->dbSize = (Pgno)((long)(local_38 + uVar5 + -1) / (long)uVar5);
        pPager->pageSize = uVar5;
        pPager->lckPgno = (uint)sqlite3PendingByte / szPage + 1;
      }
      else {
        pcache1Free(pcVar4);
      }
    }
  }
  *pPageSize = (u32)pPager->pageSize;
  if (iVar2 == 0) {
    if (nReserve < 0) {
      nReserve = (int)(ushort)pPager->nReserve;
    }
    pPager->nReserve = (i16)nReserve;
    pagerFixMaplimit(pPager);
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerSetPagesize(Pager *pPager, u32 *pPageSize, int nReserve){
  int rc = SQLITE_OK;

  /* It is not possible to do a full assert_pager_state() here, as this
  ** function may be called from within PagerOpen(), before the state
  ** of the Pager object is internally consistent.
  **
  ** At one point this function returned an error if the pager was in
  ** PAGER_ERROR state. But since PAGER_ERROR state guarantees that
  ** there is at least one outstanding page reference, this function
  ** is a no-op for that case anyhow.
  */

  u32 pageSize = *pPageSize;
  assert( pageSize==0 || (pageSize>=512 && pageSize<=SQLITE_MAX_PAGE_SIZE) );
  if( (pPager->memDb==0 || pPager->dbSize==0)
   && sqlite3PcacheRefCount(pPager->pPCache)==0
   && pageSize && pageSize!=(u32)pPager->pageSize
  ){
    char *pNew = NULL;             /* New temp space */
    i64 nByte = 0;

    if( pPager->eState>PAGER_OPEN && isOpen(pPager->fd) ){
      rc = sqlite3OsFileSize(pPager->fd, &nByte);
    }
    if( rc==SQLITE_OK ){
      /* 8 bytes of zeroed overrun space is sufficient so that the b-tree
      * cell header parser will never run off the end of the allocation */
      pNew = (char *)sqlite3PageMalloc(pageSize+8);
      if( !pNew ){
        rc = SQLITE_NOMEM_BKPT;
      }else{
        memset(pNew+pageSize, 0, 8);
      }
    }

    if( rc==SQLITE_OK ){
      pager_reset(pPager);
      rc = sqlite3PcacheSetPageSize(pPager->pPCache, pageSize);
    }
    if( rc==SQLITE_OK ){
      sqlite3PageFree(pPager->pTmpSpace);
      pPager->pTmpSpace = pNew;
      pPager->dbSize = (Pgno)((nByte+pageSize-1)/pageSize);
      pPager->pageSize = pageSize;
      pPager->lckPgno = (Pgno)(PENDING_BYTE/pageSize) + 1;
    }else{
      sqlite3PageFree(pNew);
    }
  }

  *pPageSize = pPager->pageSize;
  if( rc==SQLITE_OK ){
    if( nReserve<0 ) nReserve = pPager->nReserve;
    assert( nReserve>=0 && nReserve<1000 );
    pPager->nReserve = (i16)nReserve;
    pagerFixMaplimit(pPager);
  }
  return rc;
}